

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

void bson_iter_dbpointer(bson_iter_t *iter,uint32_t *collection_len,char **collection,
                        bson_oid_t **oid)

{
  size_t *psVar1;
  long *plVar2;
  byte bVar3;
  size_t sVar4;
  ulong uVar5;
  double dVar6;
  int64_t iVar7;
  _Bool _Var8;
  char cVar9;
  uint uVar10;
  int iVar11;
  undefined8 uVar12;
  size_t sVar13;
  char *pcVar14;
  code *pcVar15;
  bson_oid_t *pbVar16;
  char *__s;
  size_t nbytes;
  ulong uVar17;
  void *mem;
  uint32_t uVar18;
  uint8_t *puVar20;
  ulong uVar21;
  int32_t iVar22;
  undefined4 *extraout_RDX;
  undefined8 extraout_RDX_00;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var23;
  uint8_t *puVar24;
  anon_union_24_17_78d57918_for_value *dst;
  long lVar25;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  bson_t *pbVar26;
  bool bVar27;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_460;
  uint32_t uStack_1a0;
  _Bool _Stack_199;
  bson_t *pbStack_198;
  uint32_t uStack_190;
  uint32_t uStack_18c;
  uint8_t *puStack_188;
  char *apcStack_180 [36];
  int iVar19;
  
  if (iter != (bson_iter_t *)0x0) {
    if (collection != (char **)0x0) {
      *collection = (char *)0x0;
    }
    if (oid != (bson_oid_t **)0x0) {
      *oid = (bson_oid_t *)0x0;
    }
    if (iter->raw[iter->type] == '\f') {
      if (collection_len != (uint32_t *)0x0) {
        uVar18 = *(uint32_t *)(iter->raw + iter->d1);
        *collection_len = uVar18;
        if (uVar18 != 0) {
          *collection_len = uVar18 - 1;
        }
      }
      if (collection != (char **)0x0) {
        *collection = (char *)(iter->raw + iter->d2);
      }
      if (oid != (bson_oid_t **)0x0) {
        *oid = (bson_oid_t *)(iter->raw + iter->d3);
      }
    }
    return;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      iVar11 = *(int *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar19 = 1;
      if (1 < iVar11) {
        iVar19 = iVar11;
      }
      uVar18 = iVar19 - 1;
    }
    else {
      uVar18 = 0;
    }
    if ((bson_t *)collection_len != (bson_t *)0x0) {
      ((bson_t *)collection_len)->flags = uVar18;
    }
    return;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\t') {
      return;
    }
    return;
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\t') {
      return;
    }
    return;
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar18 = 0;
    uVar12 = 0;
    if (puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar12 = *(undefined8 *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar18 = (uint32_t)((ulong)uVar12 >> 0x20);
    }
    if ((bson_t *)collection_len != (bson_t *)0x0) {
      ((bson_t *)collection_len)->flags = uVar18;
    }
    if (extraout_RDX != (undefined4 *)0x0) {
      *extraout_RDX = (int)uVar12;
    }
    return;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\t') {
      lVar25 = *(long *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(long *)collection_len = lVar25 / 1000;
      *(long *)((bson_t *)collection_len)->padding = (lVar25 % 1000) * 1000;
      return;
    }
    ((bson_t *)collection_len)->flags = 0;
    ((bson_t *)collection_len)->len = 0;
    ((bson_t *)collection_len)->padding[0] = '\0';
    ((bson_t *)collection_len)->padding[1] = '\0';
    ((bson_t *)collection_len)->padding[2] = '\0';
    ((bson_t *)collection_len)->padding[3] = '\0';
    ((bson_t *)collection_len)->padding[4] = '\0';
    ((bson_t *)collection_len)->padding[5] = '\0';
    ((bson_t *)collection_len)->padding[6] = '\0';
    ((bson_t *)collection_len)->padding[7] = '\0';
    return;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)collection_len != (bson_t *)0x0) {
    _Var8 = _bson_iter_next_internal(iter,(char **)&puStack_188,&uStack_190,&_Stack_199);
    if (_Var8) {
      do {
        puVar24 = puStack_188;
        if (*puStack_188 != '\0') {
          sVar13 = strlen((char *)puStack_188);
          _Var8 = bson_utf8_validate((char *)puVar24,sVar13,false);
          if (!_Var8) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)collection_len != (code *)0x0) &&
           (cVar9 = (**(code **)collection_len)(iter,puVar24,extraout_RDX_00), cVar9 != '\0')) {
          return;
        }
        switch(uStack_190) {
        case 1:
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x10);
          if (pcVar15 == (code *)0x0) break;
          dVar6 = bson_iter_double(iter);
          cVar9 = (*pcVar15)(SUB84(dVar6,0),iter,puVar24,extraout_RDX_00);
          goto LAB_001118b2;
        case 2:
          pcVar14 = bson_iter_utf8(iter,(uint32_t *)apcStack_180);
          _Var8 = bson_utf8_validate(pcVar14,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var8) {
LAB_00111968:
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            return;
          }
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x18);
          goto LAB_001117d4;
        case 3:
          pbStack_198 = (bson_t *)0x0;
          uStack_1a0 = 0;
          bson_iter_document(iter,&uStack_1a0,(uint8_t **)&pbStack_198);
          _Var8 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_1a0);
          if (_Var8) {
            pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x20);
            goto LAB_0011181e;
          }
          break;
        case 4:
          pbStack_198 = (bson_t *)0x0;
          uStack_1a0 = 0;
          bson_iter_array(iter,&uStack_1a0,(uint8_t **)&pbStack_198);
          _Var8 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_1a0);
          if (_Var8) {
            pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x28);
            goto LAB_0011181e;
          }
          break;
        case 5:
          apcStack_180[0] = (char *)0x0;
          pbStack_198 = (bson_t *)((ulong)pbStack_198 & 0xffffffff00000000);
          uStack_1a0 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_198,&uStack_1a0,(uint8_t **)apcStack_180)
          ;
          if (*(code **)(((bson_t *)collection_len)->padding + 0x30) != (code *)0x0) {
            cVar9 = (**(code **)(((bson_t *)collection_len)->padding + 0x30))
                              (iter,puVar24,(ulong)pbStack_198 & 0xffffffff,uStack_1a0,
                               apcStack_180[0],extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 6:
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x38);
          goto LAB_0011178a;
        case 7:
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x40);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = bson_iter_oid(iter);
LAB_001118a3:
            cVar9 = (*pcVar15)(iter,puVar24,pbVar16,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 8:
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x48);
          if (pcVar15 != (code *)0x0) {
            _Var8 = bson_iter_bool(iter);
            uVar10 = (uint)_Var8;
LAB_00111710:
            cVar9 = (*pcVar15)(iter,puVar24,uVar10,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 9:
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x50);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_001118a3;
          }
          break;
        case 10:
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x58);
LAB_0011178a:
          if (pcVar15 == (code *)0x0) break;
LAB_00111799:
          cVar9 = (*pcVar15)(iter,puVar24,extraout_RDX_00);
          goto LAB_001118b2;
        case 0xb:
          apcStack_180[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_180);
          sVar13 = strlen(__s);
          _Var8 = bson_utf8_validate(__s,sVar13,true);
          if (!_Var8) goto LAB_00111968;
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x60);
          pcVar14 = apcStack_180[0];
          if (pcVar15 == (code *)0x0) break;
          goto LAB_0011188b;
        case 0xc:
          uStack_1a0 = 0;
          apcStack_180[0] = (char *)0x0;
          pbStack_198 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_1a0,apcStack_180,(bson_oid_t **)&pbStack_198);
          _Var8 = bson_utf8_validate(apcStack_180[0],(ulong)uStack_1a0,true);
          if (!_Var8) goto LAB_00111968;
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x68);
          pcVar14 = apcStack_180[0];
          pbVar26 = pbStack_198;
          if (pcVar15 != (code *)0x0) {
LAB_001115a8:
            cVar9 = (*pcVar15)(iter,puVar24,uStack_1a0,pcVar14,pbVar26,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 0xd:
          pcVar14 = bson_iter_code(iter,(uint32_t *)apcStack_180);
          _Var8 = bson_utf8_validate(pcVar14,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var8) goto LAB_00111968;
          pcVar15 = *(code **)(((bson_t *)collection_len)->padding + 0x70);
          goto LAB_001117d4;
        case 0xe:
          pcVar14 = bson_iter_symbol(iter,(uint32_t *)apcStack_180);
          _Var8 = bson_utf8_validate(pcVar14,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var8) goto LAB_00111968;
          pcVar15 = *(code **)((long)collection_len + 0x80);
LAB_001117d4:
          if (pcVar15 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_180[0] & 0xffffffff);
LAB_0011188b:
            cVar9 = (*pcVar15)(iter,puVar24,__s,pcVar14,extraout_RDX_00);
LAB_001118b2:
            if (cVar9 != '\0') {
              return;
            }
          }
          break;
        case 0xf:
          uStack_1a0 = 0;
          pbStack_198 = (bson_t *)0x0;
          uStack_18c = 0;
          pcVar14 = bson_iter_codewscope(iter,&uStack_1a0,&uStack_18c,(uint8_t **)&pbStack_198);
          _Var8 = bson_utf8_validate(pcVar14,(ulong)uStack_1a0,true);
          if (!_Var8) goto LAB_00111968;
          _Var8 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_18c);
          if ((_Var8) &&
             (pcVar15 = *(code **)((bson_t *)((long)collection_len + 0x80))->padding,
             pcVar15 != (code *)0x0)) {
            pbVar26 = (bson_t *)apcStack_180;
            goto LAB_001115a8;
          }
          break;
        case 0x10:
          pcVar15 = *(code **)(((bson_t *)((long)collection_len + 0x80))->padding + 8);
          if (pcVar15 != (code *)0x0) {
            uVar10 = bson_iter_int32(iter);
            goto LAB_00111710;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_180,(uint32_t *)&pbStack_198);
          if (*(code **)(((bson_t *)((long)collection_len + 0x80))->padding + 0x10) != (code *)0x0)
          {
            cVar9 = (**(code **)(((bson_t *)((long)collection_len + 0x80))->padding + 0x10))
                              (iter,puVar24,(ulong)apcStack_180[0] & 0xffffffff,
                               (ulong)pbStack_198 & 0xffffffff,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 0x12:
          pcVar15 = *(code **)(((bson_t *)((long)collection_len + 0x80))->padding + 0x18);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_001118a3;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_180);
          pcVar15 = *(code **)(((bson_t *)((long)collection_len + 0x80))->padding + 0x38);
LAB_0011181e:
          if (pcVar15 != (code *)0x0) {
            cVar9 = (*pcVar15)(iter,puVar24,(bson_t *)apcStack_180,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        default:
          if (uStack_190 == 0x7f) {
            pcVar15 = *(code **)(((bson_t *)((long)collection_len + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_190 != 0xff) break;
            pcVar15 = *(code **)(((bson_t *)((long)collection_len + 0x80))->padding + 0x28);
          }
          if (pcVar15 == (code *)0x0) break;
          puVar24 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_00111799;
        }
        if ((*(code **)((bson_t *)collection_len)->padding != (code *)0x0) &&
           (cVar9 = (**(code **)((bson_t *)collection_len)->padding)
                              (iter,(uint8_t *)
                                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                                    (ulong)*(uint32_t *)
                                            ((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4
                                            )),extraout_RDX_00), cVar9 != '\0')) {
          return;
        }
        _Var8 = _bson_iter_next_internal(iter,(char **)&puStack_188,&uStack_190,&_Stack_199);
      } while (_Var8);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_199 == true) &&
         (*(long *)(((bson_t *)((long)collection_len + 0x80))->padding + 0x30) != 0)) {
        sVar13 = strlen((char *)puStack_188);
        _Var8 = bson_utf8_validate((char *)puStack_188,sVar13,false);
        if (_Var8) {
          (**(code **)(((bson_t *)((long)collection_len + 0x80))->padding + 0x30))
                    (iter,puStack_188,uStack_190,extraout_RDX_00);
          return;
        }
      }
      if (*(code **)(((bson_t *)collection_len)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)collection_len)->padding + 8))(iter,extraout_RDX_00);
      }
    }
    return;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)collection_len;
    }
    return;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           (int)collection_len;
    }
    return;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(uint32_t **)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           collection_len;
    }
    return;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar24[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      lVar25 = *(long *)((bson_t *)collection_len)->padding;
      plVar2 = (long *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *plVar2 = *(long *)collection_len;
      plVar2[1] = lVar25;
    }
    return;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)collection_len != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)collection_len;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_460;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar27 = false;
      while( true ) {
        sVar4 = ((bson_json_reader_t *)iter)->json->pos;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)nbytes < 0) {
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
          }
          return;
        }
        if (nbytes == 0) break;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar24 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar24,puVar24 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          goto LAB_00111ddb;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) {
          return;
        }
        uVar21 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar21 != 0xffffffffffffffff) &&
           (uVar5 = ((bson_json_reader_t *)iter)->json->pos, uVar17 = uVar5 - uVar21,
           uVar21 <= uVar5 && uVar17 != 0)) {
          if (uVar17 < nbytes) {
            nbytes = uVar17;
          }
          lVar25 = uVar21 - sVar4;
          if (lVar25 < 1) {
            lVar25 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar25,nbytes);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar27 = true;
        nbytes = 0;
      }
      if (!bVar27) {
        return;
      }
LAB_00111ddb:
      if ((((bson_json_reader_t *)iter)->bson).read_state == BSON_JSON_DONE) {
        return;
      }
      _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
      return;
    }
    bson_json_reader_read_cold_1();
    p_Var23 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var23 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
      mem = (((bson_json_reader_t *)iter)->producer).data;
    }
    else {
      mem = (((bson_json_reader_t *)iter)->producer).data;
      if ((((bson_json_reader_t *)iter)->producer).cb < p_Var23 + __n + 1) {
        uVar21 = (ulong)(p_Var23 + __n) >> 1 | (ulong)(p_Var23 + __n);
        uVar21 = uVar21 >> 2 | uVar21;
        uVar21 = uVar21 >> 4 | uVar21;
        uVar21 = uVar21 >> 8 | uVar21;
        uVar21 = uVar21 >> 0x10 | uVar21;
        num_bytes = (bson_json_reader_cb)((uVar21 >> 0x20 | uVar21) + 1);
        (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
        mem = bson_realloc(mem,(size_t)num_bytes);
        (((bson_json_reader_t *)iter)->producer).data = mem;
      }
    }
    memcpy((bson_json_destroy_cb)((long)mem + (long)(((bson_json_reader_t *)iter)->producer).dcb),
           collection_len,__n);
    p_Var23 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var23;
    p_Var23[(long)(((bson_json_reader_t *)iter)->producer).data] = (_func_void_void_ptr)0x0;
    return;
  }
  puVar24 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar10 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar3 = puVar24[uVar10];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar3
  ;
  switch(bVar3) {
  case 1:
    dVar6 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar6;
    break;
  case 2:
    pcVar14 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar16 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111b7e;
  case 8:
    _Var8 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var8;
    break;
  case 9:
    pcVar14 = (char *)bson_iter_date_time(iter);
    goto LAB_00111c23;
  case 0xb:
    pcVar14 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar16 = (bson_oid_t *)0x0;
    if (puVar24[uVar10] == '\f') {
      uVar10 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar11 = *(int *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar11 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar11;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar24 + uVar10);
      pbVar16 = (bson_oid_t *)(puVar24 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111b7e:
    bson_oid_copy(pbVar16,&dst->v_oid);
    break;
  case 0xd:
    if (puVar24[uVar10] == '\r') {
      iVar11 = 1;
      if (1 < *(int *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar11 = *(int *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar11 = iVar11 + -1;
      puVar20 = puVar24 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      iVar11 = 0;
      puVar20 = (uint8_t *)0x0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar11;
    goto LAB_00111c30;
  case 0xe:
    if (puVar24[uVar10] == '\x0e') {
      puVar20 = puVar24 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar11 = 1;
      if (1 < *(int *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar11 = *(int *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar11 = iVar11 + -1;
    }
    else {
      puVar20 = (uint8_t *)0x0;
      iVar11 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar11;
LAB_00111c30:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar20;
    break;
  case 0xf:
    pcVar14 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0x10:
    iVar22 = 0;
    if (puVar24[uVar10] == '\x10') {
      iVar22 = *(int32_t *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar22;
    break;
  case 0x11:
    iVar22 = 0;
    uVar12 = 0;
    if (puVar24[uVar10] == '\x11') {
      uVar12 = *(undefined8 *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar22 = (int32_t)((ulong)uVar12 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar22;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar12;
    break;
  case 0x12:
    if (puVar24[uVar10] == '\x12') {
      pcVar14 = *(char **)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar14 = (char *)0x0;
    }
LAB_00111c23:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar14;
    break;
  case 0x13:
    if (puVar24[uVar10] == '\x13') {
      iVar7 = *(int64_t *)
               ((long)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar24 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar7;
    }
    break;
  default:
    if ((bVar3 != BSON_TYPE_MAXKEY) && (bVar3 != 0xff)) {
      return;
    }
  }
  return;
}

Assistant:

void
bson_iter_dbpointer (const bson_iter_t *iter,  /* IN */
                     uint32_t *collection_len, /* OUT */
                     const char **collection,  /* OUT */
                     const bson_oid_t **oid)   /* OUT */
{
   BSON_ASSERT (iter);

   if (collection) {
      *collection = NULL;
   }

   if (oid) {
      *oid = NULL;
   }

   if (ITER_TYPE (iter) == BSON_TYPE_DBPOINTER) {
      if (collection_len) {
         memcpy (
            collection_len, (iter->raw + iter->d1), sizeof (*collection_len));
         *collection_len = BSON_UINT32_FROM_LE (*collection_len);

         if ((*collection_len) > 0) {
            (*collection_len)--;
         }
      }

      if (collection) {
         *collection = (const char *) (iter->raw + iter->d2);
      }

      if (oid) {
         *oid = (const bson_oid_t *) (iter->raw + iter->d3);
      }
   }
}